

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

int32_t uloc_getKeywordValue_63
                  (char *localeID,char *keywordName,char *buffer,int32_t bufferCapacity,
                  UErrorCode *status)

{
  UBool UVar1;
  char cVar2;
  int32_t iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  bool bVar7;
  char *local_158;
  int local_14c;
  char *pcStack_148;
  int32_t keyValueLen;
  char *keyValueTail;
  char *tmpLocaleID;
  char tempBuffer [157];
  char local_88 [4];
  int32_t result;
  char localeKeywordNameBuffer [25];
  char keywordNameBuffer [25];
  char *nextSeparator;
  char *startSearchHere;
  UErrorCode *status_local;
  int32_t bufferCapacity_local;
  char *buffer_local;
  char *keywordName_local;
  char *localeID_local;
  
  if (((status == (UErrorCode *)0x0) || (UVar1 = U_SUCCESS(*status), UVar1 == '\0')) ||
     (localeID == (char *)0x0)) {
LAB_003abd6d:
    localeID_local._4_4_ = 0;
  }
  else if ((keywordName == (char *)0x0) || (*keywordName == '\0')) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    localeID_local._4_4_ = 0;
  }
  else {
    locale_canonKeywordName(localeKeywordNameBuffer + 0x18,keywordName,status);
    UVar1 = U_FAILURE(*status);
    if (UVar1 == '\0') {
      keyValueTail = localeID;
      if (((localeID != (char *)0x0) && (pcVar5 = strstr(localeID,"@"), pcVar5 == (char *)0x0)) &&
         (iVar3 = getShortestSubtagLength(localeID), iVar3 == 1)) {
        iVar3 = uloc_forLanguageTag_63(localeID,(char *)&tmpLocaleID,0x9d,(int32_t *)0x0,status);
        if (((iVar3 < 1) || (UVar1 = U_FAILURE(*status), UVar1 != '\0')) ||
           (*status == U_STRING_NOT_TERMINATED_WARNING)) {
          if (*status == U_STRING_NOT_TERMINATED_WARNING) {
            *status = U_BUFFER_OVERFLOW_ERROR;
          }
        }
        else {
          keyValueTail = (char *)&tmpLocaleID;
        }
      }
      nextSeparator = locale_getKeywordsStart_63(keyValueTail);
      if (nextSeparator == (char *)0x0) {
        localeID_local._4_4_ = 0;
      }
      else {
        do {
          if (nextSeparator == (char *)0x0) goto LAB_003abd6d;
          nextSeparator = nextSeparator + 1;
          register0x00000000 = strchr(nextSeparator,0x3d);
          if (register0x00000000 == (char *)0x0) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
          }
          for (; pcStack_148 = register0x00000000, *nextSeparator == ' ';
              nextSeparator = nextSeparator + 1) {
          }
          while( true ) {
            bVar7 = false;
            if (nextSeparator < pcStack_148) {
              bVar7 = pcStack_148[-1] == ' ';
            }
            if (!bVar7) break;
            pcStack_148 = pcStack_148 + -1;
          }
          if (nextSeparator == pcStack_148) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
          }
          local_14c = 0;
          while (nextSeparator < pcStack_148) {
            UVar1 = uprv_isASCIILetter_63(*nextSeparator);
            if ((UVar1 == '\0') && ((*nextSeparator < '0' || ('9' < *nextSeparator)))) {
              *status = U_ILLEGAL_ARGUMENT_ERROR;
              return 0;
            }
            if (0x17 < local_14c) {
              *status = U_INTERNAL_PROGRAM_ERROR;
              return 0;
            }
            cVar2 = uprv_asciitolower_63(*nextSeparator);
            local_88[local_14c] = cVar2;
            local_14c = local_14c + 1;
            nextSeparator = nextSeparator + 1;
          }
          local_88[local_14c] = '\0';
          local_158 = strchr(register0x00000000,0x3b);
          iVar4 = strcmp(localeKeywordNameBuffer + 0x18,local_88);
          nextSeparator = local_158;
        } while (iVar4 != 0);
        do {
          stack0xffffffffffffffb8 = unique0x10000211 + 1;
        } while (*stack0xffffffffffffffb8 == ' ');
        if (local_158 == (char *)0x0) {
          sVar6 = strlen(stack0xffffffffffffffb8);
          local_158 = stack0xffffffffffffffb8 + sVar6;
        }
        pcStack_148 = local_158;
        while( true ) {
          bVar7 = false;
          if (stack0xffffffffffffffb8 < pcStack_148) {
            bVar7 = pcStack_148[-1] == ' ';
          }
          if (!bVar7) break;
          pcStack_148 = pcStack_148 + -1;
        }
        if (stack0xffffffffffffffb8 == pcStack_148) {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
          localeID_local._4_4_ = 0;
        }
        else {
          local_14c = 0;
          for (; stack0xffffffffffffffb8 < pcStack_148;
              stack0xffffffffffffffb8 = stack0xffffffffffffffb8 + 1) {
            UVar1 = uprv_isASCIILetter_63(*stack0xffffffffffffffb8);
            if ((((UVar1 == '\0') &&
                 ((*stack0xffffffffffffffb8 < '0' || ('9' < *stack0xffffffffffffffb8)))) &&
                (*stack0xffffffffffffffb8 != '_')) &&
               (((*stack0xffffffffffffffb8 != '-' && (*stack0xffffffffffffffb8 != '+')) &&
                (*stack0xffffffffffffffb8 != '/')))) {
              *status = U_ILLEGAL_ARGUMENT_ERROR;
              return 0;
            }
            if (local_14c < bufferCapacity) {
              buffer[local_14c] = *stack0xffffffffffffffb8;
            }
            local_14c = local_14c + 1;
          }
          localeID_local._4_4_ = u_terminateChars_63(buffer,bufferCapacity,local_14c,status);
        }
      }
    }
    else {
      localeID_local._4_4_ = 0;
    }
  }
  return localeID_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getKeywordValue(const char* localeID,
                     const char* keywordName,
                     char* buffer, int32_t bufferCapacity,
                     UErrorCode* status)
{
    const char* startSearchHere = NULL;
    const char* nextSeparator = NULL;
    char keywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    char localeKeywordNameBuffer[ULOC_KEYWORD_BUFFER_LEN];
    int32_t result = 0;

    if(status && U_SUCCESS(*status) && localeID) {
      char tempBuffer[ULOC_FULLNAME_CAPACITY];
      const char* tmpLocaleID;

      if (keywordName == NULL || keywordName[0] == 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
      }

      locale_canonKeywordName(keywordNameBuffer, keywordName, status);
      if(U_FAILURE(*status)) {
        return 0;
      }

      if (_hasBCP47Extension(localeID)) {
          _ConvertBCP47(tmpLocaleID, localeID, tempBuffer, sizeof(tempBuffer), status);
      } else {
          tmpLocaleID=localeID;
      }

      startSearchHere = locale_getKeywordsStart(tmpLocaleID);
      if(startSearchHere == NULL) {
          /* no keywords, return at once */
          return 0;
      }

      /* find the first keyword */
      while(startSearchHere) {
          const char* keyValueTail;
          int32_t keyValueLen;

          startSearchHere++; /* skip @ or ; */
          nextSeparator = uprv_strchr(startSearchHere, '=');
          if(!nextSeparator) {
              *status = U_ILLEGAL_ARGUMENT_ERROR; /* key must have =value */
              return 0;
          }
          /* strip leading & trailing spaces (TC decided to tolerate these) */
          while(*startSearchHere == ' ') {
              startSearchHere++;
          }
          keyValueTail = nextSeparator;
          while (keyValueTail > startSearchHere && *(keyValueTail-1) == ' ') {
              keyValueTail--;
          }
          /* now keyValueTail points to first char after the keyName */
          /* copy & normalize keyName from locale */
          if (startSearchHere == keyValueTail) {
              *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty keyword name in passed-in locale */
              return 0;
          }
          keyValueLen = 0;
          while (startSearchHere < keyValueTail) {
            if (!UPRV_ISALPHANUM(*startSearchHere)) {
              *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed keyword name */
              return 0;
            }
            if (keyValueLen < ULOC_KEYWORD_BUFFER_LEN - 1) {
              localeKeywordNameBuffer[keyValueLen++] = uprv_tolower(*startSearchHere++);
            } else {
              /* keyword name too long for internal buffer */
              *status = U_INTERNAL_PROGRAM_ERROR;
              return 0;
            }
          }
          localeKeywordNameBuffer[keyValueLen] = 0; /* terminate */

          startSearchHere = uprv_strchr(nextSeparator, ';');

          if(uprv_strcmp(keywordNameBuffer, localeKeywordNameBuffer) == 0) {
               /* current entry matches the keyword. */
             nextSeparator++; /* skip '=' */
              /* First strip leading & trailing spaces (TC decided to tolerate these) */
              while(*nextSeparator == ' ') {
                nextSeparator++;
              }
              keyValueTail = (startSearchHere)? startSearchHere: nextSeparator + uprv_strlen(nextSeparator);
              while(keyValueTail > nextSeparator && *(keyValueTail-1) == ' ') {
                keyValueTail--;
              }
              /* Now copy the value, but check well-formedness */
              if (nextSeparator == keyValueTail) {
                *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty key value name in passed-in locale */
                return 0;
              }
              keyValueLen = 0;
              while (nextSeparator < keyValueTail) {
                if (!UPRV_ISALPHANUM(*nextSeparator) && !UPRV_OK_VALUE_PUNCTUATION(*nextSeparator)) {
                  *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed key value */
                  return 0;
                }
                if (keyValueLen < bufferCapacity) {
                  /* Should we lowercase value to return here? Tests expect as-is. */
                  buffer[keyValueLen++] = *nextSeparator++;
                } else { /* keep advancing so we return correct length in case of overflow */
                  keyValueLen++;
                  nextSeparator++;
                }
              }
              result = u_terminateChars(buffer, bufferCapacity, keyValueLen, status);
              return result;
          }
      }
    }
    return 0;
}